

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ae7ce::SuperBlockSizeTestLarge::~SuperBlockSizeTestLarge
          (SuperBlockSizeTestLarge *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~SuperBlockSizeTestLarge() override = default;